

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrBodySkeletonJointHTC *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  XrBodySkeletonJointHTC *in_stack_ffffffffffffff68;
  allocator local_89;
  string pose_prefix;
  undefined1 local_68 [32];
  string local_48;
  
  PointerToHexString<XrBodySkeletonJointHTC>(in_stack_ffffffffffffff68);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&pose_prefix);
  std::__cxx11::string::~string((string *)&pose_prefix);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_68 + 0x20),(string *)&pose_prefix);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_68;
  std::__cxx11::string::string((string *)gen_dispatch_table_00,"XrPosef",&local_89);
  bVar1 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->pose,(string *)(local_68 + 0x20),
                     (string *)local_68,false,contents);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  if (bVar1) {
    std::__cxx11::string::~string((string *)&pose_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrBodySkeletonJointHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}